

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_group_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  void *pvVar15;
  undefined1 auVar16 [16];
  char cVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int64_t i02;
  long lVar23;
  ulong uVar24;
  char *pcVar25;
  int64_t i02_1;
  long lVar26;
  ulong uVar27;
  int64_t i02_2;
  ulong uVar28;
  long lVar29;
  undefined8 uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int64_t i01_1;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [64];
  double dVar43;
  long local_108;
  long local_100;
  long local_d8;
  long local_d0;
  
  pgVar4 = dst->src[0];
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xdb7,"fatal error");
  }
  cVar17 = ggml_are_same_shape(pgVar4);
  if (cVar17 == '\0') {
    pcVar25 = "ggml_are_same_shape(src0, dst)";
    uVar30 = 0xd65;
  }
  else {
    if (pgVar4->nb[0] == 4) {
      sVar5 = pgVar4->nb[3];
      sVar6 = dst->nb[3];
      fVar1 = (float)dst->op_params[1];
      uVar7 = pgVar4->ne[3];
      lVar31 = (long)params->ith;
      lVar34 = (long)params->nth;
      uVar8 = pgVar4->ne[0];
      uVar9 = pgVar4->ne[1];
      sVar10 = pgVar4->nb[1];
      sVar11 = pgVar4->nb[2];
      sVar12 = dst->nb[1];
      sVar13 = dst->nb[2];
      iVar2 = (int)pgVar4->ne[2];
      iVar3 = dst->op_params[0];
      iVar18 = (iVar2 + -1 + iVar3) / iVar3;
      uVar27 = ~((long)uVar9 >> 0x3f) & uVar9;
      uVar36 = ~((long)uVar8 >> 0x3f) & uVar8;
      lVar20 = (long)iVar18;
      local_d0 = sVar11 * lVar31 * lVar20;
      local_d8 = sVar13 * lVar31 * lVar20;
      for (; lVar31 < iVar3; lVar31 = lVar31 + lVar34) {
        lVar32 = lVar31 * lVar20;
        local_100 = local_d8;
        local_108 = local_d0;
        iVar19 = iVar18 + (int)lVar32;
        if (iVar2 <= iVar19) {
          iVar19 = iVar2;
        }
        lVar21 = (long)iVar19;
        dVar39 = (double)(long)((lVar21 - lVar32) * uVar9 * uVar8);
        for (uVar24 = 0; uVar24 != (~((long)uVar7 >> 0x3f) & uVar7); uVar24 = uVar24 + 1) {
          dVar40 = 0.0;
          lVar22 = local_108;
          for (lVar23 = lVar32; lVar23 < lVar21; lVar23 = lVar23 + 1) {
            lVar26 = lVar22;
            for (uVar28 = 0; uVar28 != uVar27; uVar28 = uVar28 + 1) {
              auVar42 = ZEXT864(0) << 0x40;
              for (uVar35 = 0; uVar36 != uVar35; uVar35 = uVar35 + 1) {
                auVar42 = ZEXT864((ulong)(auVar42._0_8_ +
                                         (double)*(float *)((long)pgVar4->data + uVar35 * 4 + lVar26
                                                           )));
              }
              dVar40 = dVar40 + auVar42._0_8_;
              lVar26 = lVar26 + sVar10;
            }
            lVar22 = lVar22 + sVar11;
          }
          dVar41 = 0.0;
          lVar22 = local_108;
          lVar23 = local_100;
          for (lVar26 = lVar32; lVar26 < lVar21; lVar26 = lVar26 + 1) {
            lVar29 = lVar22;
            lVar33 = lVar23;
            for (uVar28 = 0; uVar28 != uVar27; uVar28 = uVar28 + 1) {
              pvVar14 = dst->data;
              pvVar15 = pgVar4->data;
              dVar43 = 0.0;
              uVar35 = 0;
              while( true ) {
                if (uVar36 == uVar35) break;
                fVar38 = *(float *)((long)pvVar15 + uVar35 * 4 + lVar29) - (float)(dVar40 / dVar39);
                *(float *)((long)pvVar14 + uVar35 * 4 + lVar33) = fVar38;
                uVar35 = uVar35 + 1;
                dVar43 = dVar43 + (double)(fVar38 * fVar38);
              }
              dVar41 = dVar41 + dVar43;
              lVar33 = lVar33 + sVar12;
              lVar29 = lVar29 + sVar10;
            }
            lVar23 = lVar23 + sVar13;
            lVar22 = lVar22 + sVar11;
          }
          fVar38 = (float)(dVar41 / dVar39) + fVar1;
          if (fVar38 < 0.0) {
            fVar38 = sqrtf(fVar38);
          }
          else {
            auVar16 = vsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
            fVar38 = auVar16._0_4_;
          }
          lVar23 = local_100;
          for (lVar22 = lVar32; uVar28 = uVar27, lVar26 = lVar23, lVar22 < lVar21;
              lVar22 = lVar22 + 1) {
            while (bVar37 = uVar28 != 0, uVar28 = uVar28 - 1, bVar37) {
              ggml_vec_scale_f32((int)uVar8,(float *)((long)dst->data + lVar26),1.0 / fVar38);
              lVar26 = lVar26 + sVar12;
            }
            lVar23 = lVar23 + sVar13;
          }
          local_108 = local_108 + sVar5;
          local_100 = local_100 + sVar6;
        }
        local_d0 = local_d0 + sVar11 * lVar34 * lVar20;
        local_d8 = local_d8 + sVar13 * lVar34 * lVar20;
      }
      return;
    }
    pcVar25 = "src0->nb[0] == sizeof(float)";
    uVar30 = 0xd67;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar30,"GGML_ASSERT(%s) failed",pcVar25);
}

Assistant:

void ggml_compute_forward_group_norm(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_group_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}